

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O2

void __thiscall spv::Builder::postProcessCFG(Builder *this)

{
  Function *pFVar1;
  Block *root;
  Builder *pBVar2;
  Id IVar3;
  pointer ppFVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  iterator __position;
  __node_base *p_Var9;
  pointer puVar10;
  __node_base *p_Var11;
  pointer ppBVar12;
  Block *b;
  Id local_144;
  Builder *local_140;
  pointer local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
  unreachableMerges;
  unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
  headerForUnreachableContinue;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unreachableDefinitions;
  unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
  reachableBlocks;
  
  reachableBlocks._M_h._M_buckets = &reachableBlocks._M_h._M_single_bucket;
  reachableBlocks._M_h._M_bucket_count = 1;
  reachableBlocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reachableBlocks._M_h._M_element_count = 0;
  reachableBlocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reachableBlocks._M_h._M_rehash_policy._M_next_resize = 0;
  reachableBlocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  headerForUnreachableContinue._M_h._M_buckets = &headerForUnreachableContinue._M_h._M_single_bucket
  ;
  headerForUnreachableContinue._M_h._M_bucket_count = 1;
  headerForUnreachableContinue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  headerForUnreachableContinue._M_h._M_element_count = 0;
  headerForUnreachableContinue._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  headerForUnreachableContinue._M_h._M_rehash_policy._M_next_resize = 0;
  headerForUnreachableContinue._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unreachableMerges._M_h._M_buckets = &unreachableMerges._M_h._M_single_bucket;
  unreachableMerges._M_h._M_bucket_count = 1;
  unreachableMerges._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unreachableMerges._M_h._M_element_count = 0;
  unreachableMerges._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unreachableMerges._M_h._M_rehash_policy._M_next_resize = 0;
  unreachableMerges._M_h._M_single_bucket = (__node_base_ptr)0x0;
  unreachableDefinitions._M_h._M_buckets = &unreachableDefinitions._M_h._M_single_bucket;
  unreachableDefinitions._M_h._M_bucket_count = 1;
  unreachableDefinitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unreachableDefinitions._M_h._M_element_count = 0;
  unreachableDefinitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unreachableDefinitions._M_h._M_rehash_policy._M_next_resize = 0;
  unreachableDefinitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ppFVar4 = (this->module).functions.
            super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_140 = this;
  do {
    pBVar2 = local_140;
    if (ppFVar4 ==
        (local_140->module).functions.
        super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var9 = &headerForUnreachableContinue._M_h._M_before_begin;
      p_Var11 = &unreachableMerges._M_h._M_before_begin;
      while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
        Block::rewriteAsCanonicalUnreachableMerge((Block *)p_Var11[1]._M_nxt);
      }
      while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
        Block::rewriteAsCanonicalUnreachableContinue
                  ((Block *)p_Var9[1]._M_nxt,
                   *(Block **)&((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor);
      }
      __position._M_node =
           (pBVar2->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)__position._M_node !=
             &(pBVar2->decorations)._M_t._M_impl.super__Rb_tree_header) {
        IVar3 = Instruction::getIdOperand(*(Instruction **)(__position._M_node + 1),0);
        b = (Block *)CONCAT44(b._4_4_,IVar3);
        sVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&unreachableDefinitions._M_h,(key_type *)&b);
        if (sVar8 == 0) {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        else {
          __position = std::
                       _Rb_tree<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::_Identity<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                       ::erase_abi_cxx11_((_Rb_tree<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::_Identity<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                                           *)&pBVar2->decorations,__position._M_node);
        }
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&unreachableDefinitions._M_h);
      std::
      _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&unreachableMerges._M_h);
      std::
      _Hashtable<spv::Block_*,_std::pair<spv::Block_*const,_spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>,_std::__detail::_Select1st,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&headerForUnreachableContinue._M_h);
      std::
      _Hashtable<const_spv::Block_*,_const_spv::Block_*,_std::allocator<const_spv::Block_*>,_std::__detail::_Identity,_std::equal_to<const_spv::Block_*>,_std::hash<const_spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&reachableBlocks._M_h);
      return;
    }
    pFVar1 = *ppFVar4;
    root = *(pFVar1->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl
            .super__Vector_impl_data._M_start;
    local_130._8_8_ = 0;
    local_138 = ppFVar4;
    local_130._M_unused._M_object = ::operator_new(0x18);
    *(unordered_set<const_spv::Block_*,_std::hash<const_spv::Block_*>,_std::equal_to<const_spv::Block_*>,_std::allocator<const_spv::Block_*>_>
      **)local_130._M_unused._0_8_ = &reachableBlocks;
    *(unordered_set<spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<spv::Block_*>_>
      **)((long)local_130._M_unused._0_8_ + 8) = &unreachableMerges;
    *(unordered_map<spv::Block_*,_spv::Block_*,_std::hash<spv::Block_*>,_std::equal_to<spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>_>
      **)((long)local_130._M_unused._0_8_ + 0x10) = &headerForUnreachableContinue;
    local_118 = std::
                _Function_handler<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp:355:13)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp:355:13)>
                ::_M_manager;
    inReadableOrder(root,(function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)> *)&local_130
                   );
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    for (ppBVar12 = (pFVar1->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppBVar12 !=
        (pFVar1->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppBVar12 = ppBVar12 + 1) {
      b = *ppBVar12;
      sVar5 = std::
              _Hashtable<spv::Block_*,_spv::Block_*,_std::allocator<spv::Block_*>,_std::__detail::_Identity,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&unreachableMerges._M_h,&b);
      if (sVar5 == 0) {
        sVar6 = std::
                _Hashtable<spv::Block_*,_std::pair<spv::Block_*const,_spv::Block_*>,_std::allocator<std::pair<spv::Block_*const,_spv::Block_*>_>,_std::__detail::_Select1st,_std::equal_to<spv::Block_*>,_std::hash<spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&headerForUnreachableContinue._M_h,&b);
        if (sVar6 != 0) goto LAB_00368385;
        sVar7 = std::
                _Hashtable<const_spv::Block_*,_const_spv::Block_*,_std::allocator<const_spv::Block_*>,_std::__detail::_Identity,_std::equal_to<const_spv::Block_*>,_std::hash<const_spv::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&reachableBlocks._M_h,&b);
        if (sVar7 == 0) {
          for (puVar10 = (b->instructions).
                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              puVar10 !=
              (b->instructions).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
            local_144 = ((puVar10->_M_t).
                         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->resultId;
            std::__detail::
            _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&unreachableDefinitions,&local_144);
          }
        }
      }
      else {
LAB_00368385:
        puVar10 = (b->instructions).
                  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while (puVar10 = puVar10 + 1,
              puVar10 !=
              (b->instructions).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          local_144 = ((puVar10->_M_t).
                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->resultId;
          std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&unreachableDefinitions,&local_144);
        }
      }
    }
    ppFVar4 = local_138 + 1;
  } while( true );
}

Assistant:

void Builder::postProcessCFG()
{
    // reachableBlocks is the set of blockss reached via control flow, or which are
    // unreachable continue targert or unreachable merge.
    std::unordered_set<const Block*> reachableBlocks;
    std::unordered_map<Block*, Block*> headerForUnreachableContinue;
    std::unordered_set<Block*> unreachableMerges;
    std::unordered_set<Id> unreachableDefinitions;
    // Collect IDs defined in unreachable blocks. For each function, label the
    // reachable blocks first. Then for each unreachable block, collect the
    // result IDs of the instructions in it.
    for (auto fi = module.getFunctions().cbegin(); fi != module.getFunctions().cend(); fi++) {
        Function* f = *fi;
        Block* entry = f->getEntryBlock();
        inReadableOrder(entry,
            [&reachableBlocks, &unreachableMerges, &headerForUnreachableContinue]
            (Block* b, ReachReason why, Block* header) {
               reachableBlocks.insert(b);
               if (why == ReachDeadContinue) headerForUnreachableContinue[b] = header;
               if (why == ReachDeadMerge) unreachableMerges.insert(b);
            });
        for (auto bi = f->getBlocks().cbegin(); bi != f->getBlocks().cend(); bi++) {
            Block* b = *bi;
            if (unreachableMerges.count(b) != 0 || headerForUnreachableContinue.count(b) != 0) {
                auto ii = b->getInstructions().cbegin();
                ++ii; // Keep potential decorations on the label.
                for (; ii != b->getInstructions().cend(); ++ii)
                    unreachableDefinitions.insert(ii->get()->getResultId());
            } else if (reachableBlocks.count(b) == 0) {
                // The normal case for unreachable code.  All definitions are considered dead.
                for (auto ii = b->getInstructions().cbegin(); ii != b->getInstructions().cend(); ++ii)
                    unreachableDefinitions.insert(ii->get()->getResultId());
            }
        }
    }

    // Modify unreachable merge blocks and unreachable continue targets.
    // Delete their contents.
    for (auto mergeIter = unreachableMerges.begin(); mergeIter != unreachableMerges.end(); ++mergeIter) {
        (*mergeIter)->rewriteAsCanonicalUnreachableMerge();
    }
    for (auto continueIter = headerForUnreachableContinue.begin();
         continueIter != headerForUnreachableContinue.end();
         ++continueIter) {
        Block* continue_target = continueIter->first;
        Block* header = continueIter->second;
        continue_target->rewriteAsCanonicalUnreachableContinue(header);
    }

    // Remove unneeded decorations, for unreachable instructions
    for (auto decorationIter = decorations.begin(); decorationIter != decorations.end();) {
        Id decorationId = (*decorationIter)->getIdOperand(0);
        if (unreachableDefinitions.count(decorationId) != 0) {
            decorationIter = decorations.erase(decorationIter);
        } else {
            ++decorationIter;
        }
    }
}